

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O1

void __thiscall libtorrent::aux::session_impl::update_dht(session_impl *this)

{
  ulong uVar1;
  string *psVar2;
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> local_28;
  
  local_28._M_device = &(this->m_settings).m_mutex;
  local_28._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  uVar1 = (this->m_settings).m_store.m_bools.super__Base_bitset<2UL>._M_w[0];
  ::std::unique_lock<std::mutex>::~unique_lock(&local_28);
  if ((uVar1 >> 0x3e & 1) == 0) {
    stop_dht(this);
  }
  else {
    psVar2 = session_settings::get_str_abi_cxx11_(&this->m_settings,0xb);
    if ((psVar2->_M_string_length == 0) ||
       ((this->m_dht_router_nodes).
        super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->m_dht_router_nodes).
        super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      start_dht(this);
    }
    else {
      update_dht_bootstrap_nodes(this);
    }
  }
  return;
}

Assistant:

void session_impl::update_dht()
	{
#ifndef TORRENT_DISABLE_DHT
		if (m_settings.get_bool(settings_pack::enable_dht))
		{
			if (!m_settings.get_str(settings_pack::dht_bootstrap_nodes).empty()
				&& m_dht_router_nodes.empty())
			{
				// if we have bootstrap nodes configured, make sure we initiate host
				// name lookups. once these complete, the DHT will be started.
				// they are tracked by m_outstanding_router_lookups
				update_dht_bootstrap_nodes();
			}
			else
			{
				start_dht();
			}
		}
		else
			stop_dht();
#endif
	}